

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void **ppvVar1;
  RemoveConst<void_*> *ppvVar2;
  ArrayDisposer *pAVar3;
  void **ppvVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Fault f;
  DebugComparison<const_capnp::word_*,_void_*&> _kjCondition;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_0027dcf8;
  if (this->returnedFirstSegment == true) {
    if (this->ownFirstSegment == true) {
      free(this->firstSegment);
    }
    else if ((this->super_MessageBuilder).allocatedArena == true) {
      AVar5 = capnp::_::BuilderArena::getSegmentsForOutput
                        ((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
      if (AVar5.size_ != 0) {
        _kjCondition.left = (AVar5.ptr)->ptr;
        _kjCondition.right = &this->firstSegment;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == (word *)this->firstSegment;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,void*&>&,char_const(&)[76]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                     ,0xed,FAILED,"segments[0].begin() == firstSegment",
                     "_kjCondition,\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,&_kjCondition,
                     (char (*) [76])
                     "First segment in getSegmentsForOutput() is not the first segment allocated?");
          kj::_::Debug::Fault::fatal(&f);
        }
        memset((word *)this->firstSegment,0,(AVar5.ptr)->size_ << 3);
      }
    }
    ppvVar1 = (this->moreSegments).builder.pos;
    for (ppvVar4 = (this->moreSegments).builder.ptr; ppvVar4 != ppvVar1; ppvVar4 = ppvVar4 + 1) {
      free(*ppvVar4);
    }
  }
  ppvVar4 = (this->moreSegments).builder.ptr;
  if (ppvVar4 != (void **)0x0) {
    ppvVar2 = (this->moreSegments).builder.pos;
    ppvVar1 = (this->moreSegments).builder.endPtr;
    (this->moreSegments).builder.ptr = (void **)0x0;
    (this->moreSegments).builder.pos = (RemoveConst<void_*> *)0x0;
    (this->moreSegments).builder.endPtr = (void **)0x0;
    pAVar3 = (this->moreSegments).builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,ppvVar4,8,(long)ppvVar2 - (long)ppvVar4 >> 3,
               (long)ppvVar1 - (long)ppvVar4 >> 3,0);
  }
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__FlatMessageBuilder_0027dca8;
  if ((this->super_MessageBuilder).allocatedArena == true) {
    capnp::_::BuilderArena::~BuilderArena((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
    return;
  }
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}